

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

string * DollSerialize_abi_cxx11_(string *__return_storage_ptr__,array<int,_15UL> *list)

{
  int in_EDX;
  int extraout_EDX;
  long lVar1;
  string sStack_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (lVar1 = 0; lVar1 != 0x3c; lVar1 = lVar1 + 4) {
    util::to_string_abi_cxx11_
              (&sStack_48,(util *)(ulong)*(uint *)((long)list->_M_elems + lVar1),in_EDX);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_48);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    in_EDX = extraout_EDX;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DollSerialize(const std::array<int, 15> &list)
{
	std::string serialized;

	UTIL_FOREACH(list, item)
	{
		serialized.append(util::to_string(item));
		serialized.append(",");
	}

	return serialized;
}